

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any_suite.cpp
# Opt level: O0

void to_suite::convert_integer(void)

{
  bool bVar1;
  type_info *ptVar2;
  unsigned_long_long local_300 [2];
  any local_2f0;
  any result_9;
  variable data_9;
  integer_type_conflict6 input_9;
  any local_2a0;
  any result_8;
  variable data_8;
  integer_type_conflict5 input_8;
  any local_250;
  any result_7;
  variable data_7;
  integer_type_conflict6 input_7;
  any local_200;
  any result_6;
  variable data_6;
  undefined8 local_1c0;
  integer_type_conflict5 input_6;
  any local_1b0;
  any result_5;
  variable data_5;
  undefined4 local_16c;
  int local_168;
  integer_type_conflict4 input_5;
  any local_160;
  any result_4;
  variable data_4;
  integer_type_conflict3 input_4;
  any result_3;
  variable data_3;
  integer_type_conflict2 input_3;
  any result_2;
  variable data_2;
  integer_type_conflict1 input_2;
  any result_1;
  variable data_1;
  undefined1 local_5f;
  char local_5e [7];
  integer_type_conflict input_1;
  any local_50;
  any result;
  variable data;
  undefined1 local_9 [8];
  integer_type input;
  
  local_9[0] = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<signed_char>
            ((basic_variable<std::allocator<char>_> *)&result,'\x02');
  trial::dynamic::convert::into<boost::any,trial::dynamic::basic_variable<std::allocator<char>>>
            ((convert *)&local_50,(basic_variable<std::allocator<char>_> *)&result);
  ptVar2 = boost::any::type(&local_50);
  bVar1 = std::type_info::operator==(ptVar2,(type_info *)&signed_char::typeinfo);
  boost::detail::test_impl
            ("result.type() == typeid(integer_type)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/convert/boost/any_suite.cpp"
             ,0x177,"void to_suite::convert_integer()",bVar1);
  local_5e[0] = boost::any_cast<signed_char>(&local_50);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,signed_char,signed_char>
            ("boost::any_cast<integer_type>(result)","input",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/convert/boost/any_suite.cpp"
             ,0x178,"void to_suite::convert_integer()",local_5e,local_9);
  boost::any::~any(&local_50);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&result);
  local_5f = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<unsigned_char>
            ((basic_variable<std::allocator<char>_> *)&result_1,'\x02');
  trial::dynamic::convert::into<boost::any,trial::dynamic::basic_variable<std::allocator<char>>>
            ((convert *)&stack0xffffffffffffff60,(basic_variable<std::allocator<char>_> *)&result_1)
  ;
  ptVar2 = boost::any::type((any *)&stack0xffffffffffffff60);
  bVar1 = std::type_info::operator==(ptVar2,(type_info *)&unsigned_char::typeinfo);
  boost::detail::test_impl
            ("result.type() == typeid(integer_type)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/convert/boost/any_suite.cpp"
             ,0x17f,"void to_suite::convert_integer()",bVar1);
  data_2.storage._46_1_ = boost::any_cast<unsigned_char>((any *)&stack0xffffffffffffff60);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_char,unsigned_char>
            ("boost::any_cast<integer_type>(result)","input",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/convert/boost/any_suite.cpp"
             ,0x180,"void to_suite::convert_integer()",&data_2.storage.field_0x2e,&local_5f);
  boost::any::~any((any *)&stack0xffffffffffffff60);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&result_1);
  data_2.storage._44_2_ = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<short>
            ((basic_variable<std::allocator<char>_> *)&result_2,2);
  trial::dynamic::convert::into<boost::any,trial::dynamic::basic_variable<std::allocator<char>>>
            ((convert *)&stack0xffffffffffffff20,(basic_variable<std::allocator<char>_> *)&result_2)
  ;
  ptVar2 = boost::any::type((any *)&stack0xffffffffffffff20);
  bVar1 = std::type_info::operator==(ptVar2,(type_info *)&short::typeinfo);
  boost::detail::test_impl
            ("result.type() == typeid(integer_type)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/convert/boost/any_suite.cpp"
             ,0x187,"void to_suite::convert_integer()",bVar1);
  data_3.storage._44_2_ = boost::any_cast<short>((any *)&stack0xffffffffffffff20);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,short,short>
            ("boost::any_cast<integer_type>(result)","input",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/convert/boost/any_suite.cpp"
             ,0x188,"void to_suite::convert_integer()",&data_3.storage.field_0x2c,
             &data_2.storage.field_0x2c);
  boost::any::~any((any *)&stack0xffffffffffffff20);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&result_2);
  data_3.storage._42_2_ = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<unsigned_short>
            ((basic_variable<std::allocator<char>_> *)&result_3,2);
  trial::dynamic::convert::into<boost::any,trial::dynamic::basic_variable<std::allocator<char>>>
            ((convert *)&input_4,(basic_variable<std::allocator<char>_> *)&result_3);
  ptVar2 = boost::any::type((any *)&input_4);
  bVar1 = std::type_info::operator==(ptVar2,(type_info *)&unsigned_short::typeinfo);
  boost::detail::test_impl
            ("result.type() == typeid(integer_type)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/convert/boost/any_suite.cpp"
             ,399,"void to_suite::convert_integer()",bVar1);
  data_4.storage._44_2_ = boost::any_cast<unsigned_short>((any *)&input_4);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_short,unsigned_short>
            ("boost::any_cast<integer_type>(result)","input",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/convert/boost/any_suite.cpp"
             ,400,"void to_suite::convert_integer()",&data_4.storage.field_0x2c,
             &data_3.storage.field_0x2a);
  boost::any::~any((any *)&input_4);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&result_3);
  data_4.storage._40_4_ = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>
            ((basic_variable<std::allocator<char>_> *)&result_4,2);
  trial::dynamic::convert::into<boost::any,trial::dynamic::basic_variable<std::allocator<char>>>
            ((convert *)&local_160,(basic_variable<std::allocator<char>_> *)&result_4);
  ptVar2 = boost::any::type(&local_160);
  bVar1 = std::type_info::operator==(ptVar2,(type_info *)&int::typeinfo);
  boost::detail::test_impl
            ("result.type() == typeid(integer_type)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/convert/boost/any_suite.cpp"
             ,0x197,"void to_suite::convert_integer()",bVar1);
  local_168 = boost::any_cast<int>(&local_160);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("boost::any_cast<integer_type>(result)","input",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/convert/boost/any_suite.cpp"
             ,0x198,"void to_suite::convert_integer()",&local_168,&data_4.storage.field_0x28);
  boost::any::~any(&local_160);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&result_4);
  local_16c = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<unsigned_int>
            ((basic_variable<std::allocator<char>_> *)&result_5,2);
  trial::dynamic::convert::into<boost::any,trial::dynamic::basic_variable<std::allocator<char>>>
            ((convert *)&local_1b0,(basic_variable<std::allocator<char>_> *)&result_5);
  ptVar2 = boost::any::type(&local_1b0);
  bVar1 = std::type_info::operator==(ptVar2,(type_info *)&unsigned_int::typeinfo);
  boost::detail::test_impl
            ("result.type() == typeid(integer_type)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/convert/boost/any_suite.cpp"
             ,0x19f,"void to_suite::convert_integer()",bVar1);
  input_6._0_4_ = boost::any_cast<unsigned_int>(&local_1b0);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_int,unsigned_int>
            ("boost::any_cast<integer_type>(result)","input",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/convert/boost/any_suite.cpp"
             ,0x1a0,"void to_suite::convert_integer()",&input_6,&local_16c);
  boost::any::~any(&local_1b0);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&result_5);
  local_1c0 = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<long>
            ((basic_variable<std::allocator<char>_> *)&result_6,2);
  trial::dynamic::convert::into<boost::any,trial::dynamic::basic_variable<std::allocator<char>>>
            ((convert *)&local_200,(basic_variable<std::allocator<char>_> *)&result_6);
  ptVar2 = boost::any::type(&local_200);
  bVar1 = std::type_info::operator==(ptVar2,(type_info *)&long::typeinfo);
  boost::detail::test_impl
            ("result.type() == typeid(integer_type)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/convert/boost/any_suite.cpp"
             ,0x1a7,"void to_suite::convert_integer()",bVar1);
  input_7 = boost::any_cast<long>(&local_200);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,long>
            ("boost::any_cast<integer_type>(result)","input",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/convert/boost/any_suite.cpp"
             ,0x1a8,"void to_suite::convert_integer()",&input_7,&local_1c0);
  boost::any::~any(&local_200);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&result_6);
  data_7.storage._40_8_ = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<unsigned_long>
            ((basic_variable<std::allocator<char>_> *)&result_7,2);
  trial::dynamic::convert::into<boost::any,trial::dynamic::basic_variable<std::allocator<char>>>
            ((convert *)&local_250,(basic_variable<std::allocator<char>_> *)&result_7);
  ptVar2 = boost::any::type(&local_250);
  bVar1 = std::type_info::operator==(ptVar2,(type_info *)&unsigned_long::typeinfo);
  boost::detail::test_impl
            ("result.type() == typeid(integer_type)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/convert/boost/any_suite.cpp"
             ,0x1af,"void to_suite::convert_integer()",bVar1);
  input_8 = boost::any_cast<unsigned_long>(&local_250);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,unsigned_long>
            ("boost::any_cast<integer_type>(result)","input",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/convert/boost/any_suite.cpp"
             ,0x1b0,"void to_suite::convert_integer()",&input_8,&data_7.storage.field_0x28);
  boost::any::~any(&local_250);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&result_7);
  data_8.storage._40_8_ = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<long_long>
            ((basic_variable<std::allocator<char>_> *)&result_8,2);
  trial::dynamic::convert::into<boost::any,trial::dynamic::basic_variable<std::allocator<char>>>
            ((convert *)&local_2a0,(basic_variable<std::allocator<char>_> *)&result_8);
  ptVar2 = boost::any::type(&local_2a0);
  bVar1 = std::type_info::operator==(ptVar2,(type_info *)&long_long::typeinfo);
  boost::detail::test_impl
            ("result.type() == typeid(integer_type)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/convert/boost/any_suite.cpp"
             ,0x1b7,"void to_suite::convert_integer()",bVar1);
  input_9 = boost::any_cast<long_long>(&local_2a0);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long_long,long_long>
            ("boost::any_cast<integer_type>(result)","input",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/convert/boost/any_suite.cpp"
             ,0x1b8,"void to_suite::convert_integer()",&input_9,&data_8.storage.field_0x28);
  boost::any::~any(&local_2a0);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&result_8);
  data_9.storage._40_8_ = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<unsigned_long_long>
            ((basic_variable<std::allocator<char>_> *)&result_9,2);
  trial::dynamic::convert::into<boost::any,trial::dynamic::basic_variable<std::allocator<char>>>
            ((convert *)&local_2f0,(basic_variable<std::allocator<char>_> *)&result_9);
  ptVar2 = boost::any::type(&local_2f0);
  bVar1 = std::type_info::operator==(ptVar2,(type_info *)&unsigned_long_long::typeinfo);
  boost::detail::test_impl
            ("result.type() == typeid(integer_type)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/convert/boost/any_suite.cpp"
             ,0x1bf,"void to_suite::convert_integer()",bVar1);
  local_300[0] = boost::any_cast<unsigned_long_long>(&local_2f0);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long_long,unsigned_long_long>
            ("boost::any_cast<integer_type>(result)","input",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/convert/boost/any_suite.cpp"
             ,0x1c0,"void to_suite::convert_integer()",local_300,&data_9.storage.field_0x28);
  boost::any::~any(&local_2f0);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&result_9);
  return;
}

Assistant:

void convert_integer()
{
    {
        using integer_type = signed char;
        integer_type input = 2;
        variable data(input);
        auto result = convert::into<boost::any>(data);
        TRIAL_PROTOCOL_TEST(result.type() == typeid(integer_type));
        TRIAL_PROTOCOL_TEST_EQUAL(boost::any_cast<integer_type>(result), input);
    }
    {
        using integer_type = unsigned char;
        integer_type input = 2U;
        variable data(input);
        auto result = convert::into<boost::any>(data);
        TRIAL_PROTOCOL_TEST(result.type() == typeid(integer_type));
        TRIAL_PROTOCOL_TEST_EQUAL(boost::any_cast<integer_type>(result), input);
    }
    {
        using integer_type = signed short int;
        integer_type input = 2;
        variable data(input);
        auto result = convert::into<boost::any>(data);
        TRIAL_PROTOCOL_TEST(result.type() == typeid(integer_type));
        TRIAL_PROTOCOL_TEST_EQUAL(boost::any_cast<integer_type>(result), input);
    }
    {
        using integer_type = unsigned short int;
        integer_type input = 2U;
        variable data(input);
        auto result = convert::into<boost::any>(data);
        TRIAL_PROTOCOL_TEST(result.type() == typeid(integer_type));
        TRIAL_PROTOCOL_TEST_EQUAL(boost::any_cast<integer_type>(result), input);
    }
    {
        using integer_type = signed int;
        integer_type input = 2;
        variable data(input);
        auto result = convert::into<boost::any>(data);
        TRIAL_PROTOCOL_TEST(result.type() == typeid(integer_type));
        TRIAL_PROTOCOL_TEST_EQUAL(boost::any_cast<integer_type>(result), input);
    }
    {
        using integer_type = unsigned int;
        integer_type input = 2U;
        variable data(input);
        auto result = convert::into<boost::any>(data);
        TRIAL_PROTOCOL_TEST(result.type() == typeid(integer_type));
        TRIAL_PROTOCOL_TEST_EQUAL(boost::any_cast<integer_type>(result), input);
    }
    {
        using integer_type = signed long int;
        integer_type input = 2L;
        variable data(input);
        auto result = convert::into<boost::any>(data);
        TRIAL_PROTOCOL_TEST(result.type() == typeid(integer_type));
        TRIAL_PROTOCOL_TEST_EQUAL(boost::any_cast<integer_type>(result), input);
    }
    {
        using integer_type = unsigned long int;
        integer_type input = 2UL;
        variable data(input);
        auto result = convert::into<boost::any>(data);
        TRIAL_PROTOCOL_TEST(result.type() == typeid(integer_type));
        TRIAL_PROTOCOL_TEST_EQUAL(boost::any_cast<integer_type>(result), input);
    }
    {
        using integer_type = signed long long int;
        integer_type input = 2LL;
        variable data(input);
        auto result = convert::into<boost::any>(data);
        TRIAL_PROTOCOL_TEST(result.type() == typeid(integer_type));
        TRIAL_PROTOCOL_TEST_EQUAL(boost::any_cast<integer_type>(result), input);
    }
    {
        using integer_type = unsigned long long int;
        integer_type input = 2ULL;
        variable data(input);
        auto result = convert::into<boost::any>(data);
        TRIAL_PROTOCOL_TEST(result.type() == typeid(integer_type));
        TRIAL_PROTOCOL_TEST_EQUAL(boost::any_cast<integer_type>(result), input);
    }
}